

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O0

longlong __thiscall std::pmr::test_resource::status(test_resource *this)

{
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  long lVar5;
  longlong numErrors;
  lock_guard<std::mutex> guard;
  test_resource *this_local;
  
  guard._M_device = (mutex_type *)this;
  lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&numErrors,&this->m_lock_);
  lVar2 = mismatches(this);
  lVar3 = bounds_errors(this);
  lVar4 = bad_deallocate_params(this);
  lVar5 = lVar2 + lVar3 + lVar4;
  if (lVar5 < 1) {
    bVar1 = has_allocations(this);
    if (bVar1) {
      this_local = (test_resource *)0xffffffffffffffff;
    }
    else {
      this_local = (test_resource *)0x0;
    }
  }
  else {
    this_local = (test_resource *)(long)(int)lVar5;
  }
  lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&numErrors);
  return (longlong)this_local;
}

Assistant:

long long test_resource::status() const noexcept
{
    static const int memoryLeak = -1;
    static const int success = 0;

    lock_guard guard{ m_lock_ };

    const long long numErrors = mismatches() + bounds_errors() +
                                bad_deallocate_params();

    if (numErrors > 0) {
        return static_cast<int>(numErrors);                           // RETURN
    }
    else if (has_allocations()) {
        return memoryLeak;                                            // RETURN
    }
    else {
        return success;                                               // RETURN
    }
}